

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O0

void __thiscall iutest::detail::IUStreamCapture::IUStreamCapture(IUStreamCapture *this,int fd)

{
  bool bVar1;
  int iVar2;
  iu_stringstream *piVar3;
  IUTestLog local_4d8;
  IUTestLog local_348;
  IUTestLog local_1b8;
  int local_14;
  IUStreamCapture *pIStack_10;
  int fd_local;
  IUStreamCapture *this_local;
  
  local_14 = fd;
  pIStack_10 = this;
  TempFile::TempFile(&this->m_tempfile);
  this->m_fd = local_14;
  iVar2 = internal::posix::Dup(local_14);
  this->m_prev_fd = iVar2;
  this->m_new_fd = -1;
  if (this->m_prev_fd == -1) {
    IUTestLog::IUTestLog
              (&local_1b8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
               ,0x2a);
    piVar3 = IUTestLog::GetStream_abi_cxx11_(&local_1b8);
    std::operator<<((ostream *)&piVar3->field_0x10,"file descriptor dup failed");
    IUTestLog::~IUTestLog(&local_1b8);
  }
  else {
    bVar1 = TempFile::Create(&this->m_tempfile,"iutest_stream_capture");
    if (!bVar1) {
      IUTestLog::IUTestLog
                (&local_348,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
                 ,0x30);
      piVar3 = IUTestLog::GetStream_abi_cxx11_(&local_348);
      std::operator<<((ostream *)&piVar3->field_0x10,"temp file open failed");
      IUTestLog::~IUTestLog(&local_348);
    }
    iVar2 = TempFile::GetDescriptor(&this->m_tempfile);
    this->m_new_fd = iVar2;
    iVar2 = internal::posix::Dup2(this->m_new_fd,local_14);
    if (iVar2 == -1) {
      IUTestLog::IUTestLog
                (&local_4d8,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
                 ,0x35);
      piVar3 = IUTestLog::GetStream_abi_cxx11_(&local_4d8);
      std::operator<<((ostream *)&piVar3->field_0x10,"file descriptor dup2 failed");
      IUTestLog::~IUTestLog(&local_4d8);
      Close(this);
    }
    TempFile::Close(&this->m_tempfile);
  }
  return;
}

Assistant:

explicit IUStreamCapture(int fd)
        : m_fd(fd), m_prev_fd(internal::posix::Dup(fd)), m_new_fd(-1)
    {
        if( m_prev_fd == -1 )
        {
            IUTEST_LOG_(WARNING) << "file descriptor dup failed";
        }
        else
        {
            if( !m_tempfile.Create("iutest_stream_capture") )
            {
                IUTEST_LOG_(WARNING) << "temp file open failed";
            }
            m_new_fd = m_tempfile.GetDescriptor();
            if( internal::posix::Dup2(m_new_fd, fd) == -1 )
            {
                IUTEST_LOG_(WARNING) << "file descriptor dup2 failed";
                Close();
            }
            m_tempfile.Close();
        }
    }